

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O0

int it_asy_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  void *pvVar2;
  DUMBFILE *in_RSI;
  long in_RDI;
  int32 truncated_size;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((*(byte *)(in_RDI + 0x32) & 0x10) == 0) ||
     (*(int *)(in_RDI + 0x38) <= *(int *)(in_RDI + 0x40))) {
    iVar1 = 0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x38) - *(int *)(in_RDI + 0x40);
    *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
  }
  pvVar2 = malloc((long)*(int *)(in_RDI + 0x38));
  *(void **)(in_RDI + 0x58) = pvVar2;
  if (*(long *)(in_RDI + 0x58) == 0) {
    iVar1 = -1;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 0) {
      dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int32)((ulong)in_RDI >> 0x20),in_RSI);
    }
    dumbfile_skip(in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    iVar1 = dumbfile_error(in_RSI);
  }
  return iVar1;
}

Assistant:

static int it_asy_read_sample_data( IT_SAMPLE *sample, DUMBFILE *f )
{
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ( ( sample->flags & IT_SAMPLE_LOOP ) && sample->loop_end < sample->length ) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc( sample->length );

	if ( !sample->data )
		return -1;

	if ( sample->length )
		dumbfile_getnc( sample->data, sample->length, f );

	dumbfile_skip( f, truncated_size );

	return dumbfile_error( f );
}